

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_databases.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBDatabasesInit(ClientContext *context,TableFunctionInitInput *input)

{
  pointer prVar1;
  DatabaseManager *this;
  pointer pDVar2;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::DuckDBDatabasesData_*,_false> local_30;
  vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> local_28;
  
  local_30._M_head_impl = (DuckDBDatabasesData *)operator_new(0x28);
  *(undefined ***)
   &(((element_type *)local_30._M_head_impl)->super_enable_shared_from_this<duckdb::ClientContext>).
    __weak_this_.internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> =
       &PTR__DuckDBDatabasesData_019b34b8;
  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(((element_type *)local_30._M_head_impl)->
          super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((element_type *)local_30._M_head_impl)->db).internal.
  super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(((element_type *)local_30._M_head_impl)->db).internal + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&((element_type *)local_30._M_head_impl)->interrupted = 0;
  this = DatabaseManager::Get((ClientContext *)input);
  DatabaseManager::GetDatabases(&local_28,this,(ClientContext *)input);
  pDVar2 = unique_ptr<duckdb::DuckDBDatabasesData,_std::default_delete<duckdb::DuckDBDatabasesData>,_true>
           ::operator->((unique_ptr<duckdb::DuckDBDatabasesData,_std::default_delete<duckdb::DuckDBDatabasesData>,_true>
                         *)&local_30);
  prVar1 = (pDVar2->entries).
           super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (pDVar2->entries).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_28.
       super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pDVar2->entries).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_28.
       super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pDVar2->entries).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_28.
       super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28.
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (prVar1 != (pointer)0x0) {
    operator_delete(prVar1);
  }
  if (local_28.
      super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBDatabasesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBDatabasesData>();

	// scan all the schemas for tables and collect them and collect them
	auto &db_manager = DatabaseManager::Get(context);
	result->entries = db_manager.GetDatabases(context);
	return std::move(result);
}